

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O0

string * __thiscall
FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,std::less<boost::shared_ptr<JPPVValuePair>>>
::SoftPrint_abi_cxx11_
          (FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
           *this)

{
  bool bVar1;
  ostream *this_00;
  void *this_01;
  reference this_02;
  type pJVar2;
  string *in_RDI;
  const_iterator it;
  size_t i;
  stringstream ss;
  list<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  *in_stack_fffffffffffffdd8;
  ostream *in_stack_fffffffffffffde0;
  string local_1e0 [48];
  _Self local_1b0;
  _Self local_1a8;
  ulong local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = 0;
  local_1a8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>::
       begin(in_stack_fffffffffffffdd8);
  while( true ) {
    local_1b0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
         ::end(in_stack_fffffffffffffdd8);
    bVar1 = std::operator!=(&local_1a8,&local_1b0);
    if (!bVar1) break;
    this_00 = std::operator<<(local_188,"FixedCapacityPriorityQueue item number ");
    this_01 = (void *)std::ostream::operator<<(this_00,local_1a0);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_02 = std::_List_const_iterator<boost::shared_ptr<JPPVValuePair>_>::operator*
                        ((_List_const_iterator<boost::shared_ptr<JPPVValuePair>_> *)
                         in_stack_fffffffffffffde0);
    pJVar2 = boost::shared_ptr<JPPVValuePair>::operator->(this_02);
    (*(pJVar2->super_JointPolicyValuePair).super_PolicyPoolItemInterface.
      _vptr_PolicyPoolItemInterface[4])(local_1e0);
    in_stack_fffffffffffffde0 = std::operator<<(local_188,local_1e0);
    std::ostream::operator<<(in_stack_fffffffffffffde0,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e0);
    std::_List_const_iterator<boost::shared_ptr<JPPVValuePair>_>::operator++(&local_1a8,0);
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string SoftPrint() const
        {
            std::stringstream ss;
            size_t i=0;
            typename std::list<T>::const_iterator it = _m_l.begin();
            while(it!=_m_l.end())
            {
                ss << "FixedCapacityPriorityQueue item number " << i << std::endl;
                ss << (*it)->SoftPrint() << std::endl;
                it++;
                i++;
            }
            return(ss.str());
        }